

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantities_testing_kernels.h
# Opt level: O2

int Quantities_scalefactor_space_(Quantities *quan,int ix_g,int iy_g,int iz_g)

{
  uint __line;
  char *__assertion;
  
  if ((ix_g < -1) || (quan->ncell_x_g < ix_g)) {
    __assertion = "ix_g >= -1 && ix_g <= quan->ncell_x_g";
    __line = 0x69;
  }
  else if ((iy_g < -1) || (quan->ncell_y_g < iy_g)) {
    __assertion = "iy_g >= -1 && iy_g <= quan->ncell_y_g";
    __line = 0x6a;
  }
  else {
    if ((-2 < iz_g) && (iz_g <= quan->ncell_z_g)) {
      return 1 << ((char)ix_g - ((char)iz_g + (char)iy_g) & 3U ^ 2);
    }
    __assertion = "iz_g >= -1 && iz_g <= quan->ncell_z_g";
    __line = 0x6b;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/3_sweeper/quantities_testing_kernels.h"
                ,__line,"int Quantities_scalefactor_space_(const Quantities *, int, int, int)");
}

Assistant:

TARGET_HD static inline int Quantities_scalefactor_space_(
                                                  const Quantities* quan,
                                                  int ix_g,
                                                  int iy_g,
                                                  int iz_g )
{
  /*---Create power of 2 based on hash of the spatial location.
  ---*/
  Assert( ix_g >= -1 && ix_g <= quan->ncell_x_g );
  Assert( iy_g >= -1 && iy_g <= quan->ncell_y_g );
  Assert( iz_g >= -1 && iz_g <= quan->ncell_z_g );

  int result = 0;

#ifndef RELAXED_TESTING
  const int im = 134456;
  const int ia = 8121;
  const int ic = 28411;

  result = ( (result+(ix_g+2))*ia + ic ) % im;
  result = ( (result+(iy_g+2))*ia + ic ) % im;
  result = ( (result+(iz_g+2))*ia + ic ) % im;
  result = ( (result+(ix_g+3*iy_g+7*iz_g+2))*ia + ic ) % im;
  result = ix_g+3*iy_g+7*iz_g+2;
  result = result & ( (1<<2) - 1 );
#endif
  result = 1 << result;

  return result;
}